

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoSimdBitSelect(Thread *this)

{
  Value VVar1;
  Value VVar2;
  Value VVar3;
  
  VVar1 = Pop(this);
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  Push(this,(Value)((undefined1  [16])VVar2.field_0 ^
                   (undefined1  [16])VVar1.field_0 &
                   ((undefined1  [16])VVar2.field_0 ^ (undefined1  [16])VVar3.field_0)));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitSelect() {
  using S = u64x2;
  auto c = Pop<S>();
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = (lhs[i] & c[i]) | (rhs[i] & ~c[i]);
  }
  Push(result);
  return RunResult::Ok;
}